

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXNodeAttribute.cpp
# Opt level: O3

void __thiscall Assimp::FBX::CameraSwitcher::~CameraSwitcher(CameraSwitcher *this)

{
  ~CameraSwitcher(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

CameraSwitcher::~CameraSwitcher()
{
    // empty
}